

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

_Bool unshield_file_save_old(Unshield *unshield,int index,char *filename)

{
  ulong uVar1;
  bool bVar2;
  _Bool _Var3;
  uint uVar4;
  uint8_t *buffer;
  void *buffer_00;
  FileDescriptor *file_descriptor;
  UnshieldReader *reader;
  uint64_t uVar5;
  char *pcVar6;
  size_t sVar7;
  uint8_t *puVar8;
  char *in_RCX;
  char *pcVar9;
  int line;
  uint8_t *extraout_RDX;
  uint8_t *pattern;
  uint8_t *extraout_RDX_00;
  uint8_t *extraout_RDX_01;
  uint8_t *extraout_RDX_02;
  uint8_t *extraout_RDX_03;
  uint8_t *extraout_RDX_04;
  ulong size;
  undefined8 uVar10;
  size_t __size;
  size_t sVar11;
  uint8_t *buffer_01;
  uint uVar12;
  long lVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  uint64_t local_a8;
  uint8_t *local_a0;
  uint local_98;
  undefined8 local_90;
  void *local_88;
  undefined4 local_80;
  size_t local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  
  buffer = (uint8_t *)malloc(0x10000);
  buffer_00 = malloc(0x10000);
  if (unshield == (Unshield *)0x0) {
LAB_00103d3a:
    reader = (UnshieldReader *)0x0;
LAB_00103d3d:
    pcVar6 = (char *)0x0;
    bVar14 = false;
  }
  else {
    file_descriptor = unshield_get_file_descriptor(unshield,index);
    if (file_descriptor == (FileDescriptor *)0x0) {
      pcVar6 = "Failed to get file descriptor for file %i";
      line = 0x441;
      goto LAB_00103d33;
    }
    if (((file_descriptor->flags & 8) != 0) || (file_descriptor->data_offset == 0))
    goto LAB_00103d3a;
    if ((file_descriptor->link_flags & 1) == 0) {
      reader = unshield_reader_create(unshield,index,file_descriptor);
      if (reader == (UnshieldReader *)0x0) {
        pcVar6 = "Failed to create data reader for file %i";
        line = 0x454;
LAB_00103d33:
        _unshield_log(1,"unshield_file_save_old",line,pcVar6,(ulong)(uint)index);
        goto LAB_00103d3a;
      }
      uVar5 = unshield_fsize(unshield,reader->volume_file);
      if (uVar5 == file_descriptor->data_offset) {
        in_RCX = "File %i is not inside the cabinet. Trying external file!";
        _unshield_log(1,"unshield_file_save_old",0x45a,
                      "File %i is not inside the cabinet. Trying external file!",(ulong)(uint)index)
        ;
        unshield_reader_destroy(reader);
        reader = unshield_reader_create_external(unshield,index,file_descriptor);
        if (reader == (UnshieldReader *)0x0) {
          pcVar6 = "Failed to create data reader for file %i";
          line = 0x45f;
          goto LAB_00103d33;
        }
      }
      if (filename == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = (char *)(*unshield->io_callbacks->fopen)(filename,"wb",unshield->io_userdata);
        if (pcVar6 == (char *)0x0) {
          _unshield_log(1,"unshield_file_save_old",0x469,"Failed to open output file \'%s\'",
                        filename);
          goto LAB_00103d3d;
        }
      }
      uVar12 = (uint)file_descriptor->expanded_size;
      __size = 0x10000;
      local_a8 = 0;
      do {
        if (uVar12 == 0) {
          bVar14 = file_descriptor->expanded_size == local_a8;
          if (!(bool)bVar14) {
            _unshield_log(1,"unshield_file_save_old",0x509,
                          "Expanded size expected to be %i, but was %i");
          }
          goto LAB_00103d40;
        }
        if ((reader->volume_bytes_left != 0) ||
           (_Var3 = unshield_reader_open_volume(reader,reader->volume + 1), _Var3)) {
          if ((file_descriptor->flags & 4) == 0) {
            sVar11 = 0x10000;
            if (uVar12 < 0x10000) {
              sVar11 = (size_t)uVar12;
            }
            _Var3 = unshield_reader_read(reader,buffer_00,sVar11);
            if (_Var3) {
              uVar12 = uVar12 - (int)sVar11;
              in_RCX = pcVar6;
              if ((pcVar6 == (char *)0x0) ||
                 (sVar7 = (*unshield->io_callbacks->fwrite)
                                    (buffer_00,1,sVar11,pcVar6,unshield->io_userdata),
                 sVar7 == sVar11)) {
                local_a8 = local_a8 + sVar11;
                bVar2 = false;
                goto LAB_001042dc;
              }
              in_RCX = "Failed to write %i bytes to file \'%s\'";
              _unshield_log(1,"unshield_file_save_old",0x4fc,
                            "Failed to write %i bytes to file \'%s\'",sVar11,filename);
            }
            else {
              in_RCX = "Failed to read %i bytes from input cabinet file %i";
              _unshield_log(1,"unshield_file_save_old",0x4f2,
                            "Failed to read %i bytes from input cabinet file %i",sVar11,
                            (ulong)file_descriptor->volume);
            }
          }
          else {
            size = (ulong)reader->volume_bytes_left;
            while (__size < size) {
              __size = __size * 2;
              in_RCX = "increased input_buffer_size to 0x%x";
              _unshield_log(3,"unshield_file_save_old",0x48a,"increased input_buffer_size to 0x%x",
                            __size);
              buffer = (uint8_t *)realloc(buffer,__size);
              if (buffer == (uint8_t *)0x0) {
                __assert_fail("input_buffer",
                              "/workspace/llm4binary/github/license_c_cmakelists/twogood[P]unshield/lib/file.c"
                              ,0x48e,"_Bool unshield_file_save_old(Unshield *, int, const char *)");
              }
            }
            _Var3 = unshield_reader_read(reader,buffer,size);
            puVar8 = extraout_RDX;
            buffer_01 = buffer;
            if (_Var3) {
LAB_00103f01:
              bVar2 = false;
              if ((size != 0) && (bVar2 = false, uVar12 != 0)) {
                puVar8 = find_bytes(buffer_01,size,puVar8,(size_t)in_RCX);
                if (puVar8 == (uint8_t *)0x0) {
                  pcVar9 = unshield_file_name(unshield,index);
                  _unshield_log(1,"unshield_file_save_old",0x4a1,
                                "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                                ,(ulong)(uint)index,pcVar9,(ulong)file_descriptor->volume);
                  puVar8 = extraout_RDX_02;
                }
                else {
                  do {
                    lVar13 = (long)puVar8 - (long)buffer_01;
                    uVar1 = lVar13 + 4;
                    if ((size < uVar1 || size - uVar1 == 0) || ((buffer_01[uVar1] & 1) == 0)) {
                      _unshield_log(3,"unshield_file_save_old",0x4c3,"chunk_size = 0x%x");
                      buffer_01[lVar13] = '\0';
                      local_98 = (uint)lVar13;
                      local_80 = 0x10000;
                      local_60 = 0;
                      uStack_58 = 0;
                      local_a0 = buffer_01;
                      local_88 = buffer_00;
                      uVar4 = inflateInit2_(&local_a0,0xfffffff1,"1.2.11",0x70);
                      if (uVar4 != 0) goto LAB_00104071;
                      goto LAB_00104047;
                    }
                    pcVar9 = "It seems like we have an end of chunk marker inside of a chunk.";
                    _unshield_log(2,"unshield_file_save_old",0x4b6,
                                  "It seems like we have an end of chunk marker inside of a chunk.")
                    ;
                    puVar8 = find_bytes(buffer_01 + uVar1,size - uVar1,pattern,(size_t)pcVar9);
                  } while (puVar8 != (uint8_t *)0x0);
                  pcVar9 = unshield_file_name(unshield,index);
                  _unshield_log(1,"unshield_file_save_old",0x4bc,
                                "Could not find end of chunk for file %i (%s) from input cabinet file %i"
                                ,(ulong)(uint)index,pcVar9,(ulong)file_descriptor->volume);
                  puVar8 = extraout_RDX_00;
                }
                goto LAB_00104127;
              }
              goto LAB_001042dc;
            }
            pcVar9 = unshield_file_name(unshield,index);
            in_RCX = "Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i";
            _unshield_log(1,"unshield_file_save_old",0x495,
                          "Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i",
                          size,(ulong)(uint)index,pcVar9,(ulong)file_descriptor->volume);
          }
          bVar2 = true;
        }
        else {
          in_RCX = "Failed to open volume %i to read %i more bytes";
          _unshield_log(1,"unshield_file_save_old",0x47c,
                        "Failed to open volume %i to read %i more bytes",(ulong)(reader->volume + 1)
                        ,(ulong)uVar12);
          bVar2 = true;
        }
LAB_001042dc:
        bVar14 = 0x85;
      } while (!bVar2);
      if (!bVar2) goto LAB_00103d7a;
      bVar14 = false;
    }
    else {
      bVar14 = unshield_file_save_old(unshield,file_descriptor->link_previous,filename);
      pcVar6 = (char *)0x0;
      reader = (UnshieldReader *)0x0;
    }
  }
LAB_00103d40:
  unshield_reader_destroy(reader);
  if (pcVar6 != (char *)0x0) {
    (*unshield->io_callbacks->fclose)(pcVar6,unshield->io_userdata);
  }
  if (buffer != (uint8_t *)0x0) {
    free(buffer);
  }
  if (buffer_00 != (void *)0x0) {
    free(buffer_00);
  }
LAB_00103d7a:
  return (_Bool)(bVar14 & 1);
  while (uVar4 = inflate(&local_a0,5), uVar4 == 0) {
LAB_00104047:
    sVar11 = local_78;
    uVar10 = local_90;
    if (local_98 < 2) {
      uVar4 = inflateEnd(&local_a0);
      goto LAB_00104077;
    }
  }
  inflateEnd(&local_a0);
LAB_00104071:
  sVar11 = 0;
  uVar10 = 0;
LAB_00104077:
  if (uVar4 == 0) {
    _unshield_log(3,"unshield_file_save_old",0x4d5,"read_bytes = 0x%x");
    buffer_01 = buffer_01 + lVar13 + 4;
    size = (size - lVar13) - 4;
    uVar12 = uVar12 - (int)sVar11;
    pcVar9 = pcVar6;
    puVar8 = extraout_RDX_03;
    if (pcVar6 != (char *)0x0) {
      auVar15 = (undefined1  [16])
                (*unshield->io_callbacks->fwrite)(buffer_00,1,sVar11,pcVar6,unshield->io_userdata);
      puVar8 = auVar15._8_8_;
      if (sVar11 != auVar15._0_8_) {
        _unshield_log(1,"unshield_file_save_old",0x4e2,"Failed to write %i bytes to file \'%s\'",
                      sVar11,filename);
        in_RCX = (char *)0x0;
        bVar2 = true;
        puVar8 = extraout_RDX_04;
        goto LAB_0010412c;
      }
    }
    local_a8 = local_a8 + sVar11;
    bVar2 = false;
    in_RCX = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),1);
  }
  else {
    _unshield_log(1,"unshield_file_save_old",0x4d0,
                  "Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i"
                  ,(ulong)uVar4,size,(ulong)reader->volume_bytes_left,(ulong)file_descriptor->volume
                  ,uVar10);
    puVar8 = extraout_RDX_01;
LAB_00104127:
    in_RCX = (char *)0x0;
    bVar2 = true;
  }
LAB_0010412c:
  if ((char)in_RCX == '\0') goto LAB_001042dc;
  goto LAB_00103f01;
}

Assistant:

bool unshield_file_save_old(Unshield* unshield, int index, const char* filename)/*{{{*/
{
  /* XXX: Thou Shalt Not Cut & Paste... */
  bool success = false;
  FILE* output = NULL;
  size_t input_buffer_size = BUFFER_SIZE;
  unsigned char* input_buffer   = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned char* output_buffer  = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned int bytes_left;
  uLong total_written = 0;
  UnshieldReader* reader = NULL;
  FileDescriptor* file_descriptor;

  if (!unshield)
    goto exit;

  if (!(file_descriptor = unshield_get_file_descriptor(unshield, index)))
  {
    unshield_error("Failed to get file descriptor for file %i", index);
    goto exit;
  }

  if ((file_descriptor->flags & FILE_INVALID) || 0 == file_descriptor->data_offset)
  {
    /* invalid file */
    goto exit;
  }

  if (file_descriptor->link_flags & LINK_PREV)
  {
    success = unshield_file_save_old(unshield, file_descriptor->link_previous, filename);
    goto exit;
  }

  reader = unshield_reader_create(unshield, index, file_descriptor);
  if (!reader)
  {
    unshield_error("Failed to create data reader for file %i", index);
    goto exit;
  }

  if (unshield_fsize(unshield, reader->volume_file) == (long)file_descriptor->data_offset)
  {
      unshield_error("File %i is not inside the cabinet. Trying external file!", index);
      unshield_reader_destroy(reader);
      reader = unshield_reader_create_external(unshield, index, file_descriptor);
      if (!reader)
      {
          unshield_error("Failed to create data reader for file %i", index);
          goto exit;
      }
  }

  if (filename) 
  {
    output = unshield_fopen(unshield, filename, "wb");
    if (!output)
    {
      unshield_error("Failed to open output file '%s'", filename);
      goto exit;
    }
  }

    bytes_left = file_descriptor->expanded_size;

#if VERBOSE >= 4
  unshield_trace("Bytes to write: %i", bytes_left);
#endif

  while (bytes_left > 0)
  {
    uLong bytes_to_write = 0;
    int result;

    if (reader->volume_bytes_left == 0 && !unshield_reader_open_volume(reader, reader->volume + 1))
    {
      unshield_error("Failed to open volume %i to read %i more bytes",
                     reader->volume + 1, bytes_left);
      goto exit;
    }

    if (file_descriptor->flags & FILE_COMPRESSED)
    {
      uLong read_bytes;
      size_t input_size = reader->volume_bytes_left;
      uint8_t* chunk_buffer;

      while (input_size > input_buffer_size) 
      {
        input_buffer_size *= 2;
#if VERBOSE >= 3
        unshield_trace("increased input_buffer_size to 0x%x", input_buffer_size);
#endif

        input_buffer = realloc(input_buffer, input_buffer_size);
        assert(input_buffer);
      }

      if (!unshield_reader_read(reader, input_buffer, input_size))
      {
#if VERBOSE
        unshield_error("Failed to read 0x%x bytes of file %i (%s) from input cabinet file %i", 
            input_size, index, unshield_file_name(unshield, index), file_descriptor->volume);
#endif
        goto exit;
      }

      for (chunk_buffer = input_buffer; input_size && bytes_left; )
      {
        size_t chunk_size;
        uint8_t* match = find_bytes(chunk_buffer, input_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
        if (!match)
        {
          unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
              index, unshield_file_name(unshield, index), file_descriptor->volume);
          goto exit;
        }

        chunk_size = match - chunk_buffer;

        /*
           Detect when the chunk actually contains the end of chunk marker.

           Needed by Qtime.smk from "The Feeble Files - spanish version".

           The first bit of a compressed block is always zero, so we apply this
           workaround if it's a one.

           A possibly more proper fix for this would be to have
           unshield_uncompress_old eat compressed data and discard chunk
           markers inbetween.
           */
        while ((chunk_size + sizeof(END_OF_CHUNK)) < input_size &&
            chunk_buffer[chunk_size + sizeof(END_OF_CHUNK)] & 1)
        {
          unshield_warning("It seems like we have an end of chunk marker inside of a chunk.");
          chunk_size += sizeof(END_OF_CHUNK);
          match = find_bytes(chunk_buffer + chunk_size, input_size - chunk_size, END_OF_CHUNK, sizeof(END_OF_CHUNK));
          if (!match)
          {
            unshield_error("Could not find end of chunk for file %i (%s) from input cabinet file %i",
                index, unshield_file_name(unshield, index), file_descriptor->volume);
            goto exit;
          }
          chunk_size = match - chunk_buffer;
        }

#if VERBOSE >= 3
        unshield_trace("chunk_size = 0x%x", chunk_size);
#endif

        /* add a null byte to make inflate happy */
        chunk_buffer[chunk_size] = 0;

        bytes_to_write = BUFFER_SIZE;
        read_bytes = chunk_size;
        result = unshield_uncompress_old(output_buffer, &bytes_to_write, chunk_buffer, &read_bytes);

        if (Z_OK != result)
        {
          unshield_error("Decompression failed with code %i. input_size=%i, volume_bytes_left=%i, volume=%i, read_bytes=%i",
              result, input_size, reader->volume_bytes_left, file_descriptor->volume, read_bytes);
          goto exit;
        }

#if VERBOSE >= 3
        unshield_trace("read_bytes = 0x%x", read_bytes);
#endif

        chunk_buffer += chunk_size;
        chunk_buffer += sizeof(END_OF_CHUNK);

        input_size -= chunk_size;
        input_size -= sizeof(END_OF_CHUNK);

          bytes_left -= bytes_to_write;

          if (output) {
              if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output)) {
                  unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
                  goto exit;
              }
          }

        total_written += bytes_to_write;
      }
    }
    else
    {
      bytes_to_write = MIN(bytes_left, BUFFER_SIZE);

      if (!unshield_reader_read(reader, output_buffer, bytes_to_write))
      {
#if VERBOSE
        unshield_error("Failed to read %i bytes from input cabinet file %i", 
            bytes_to_write, file_descriptor->volume);
#endif
        goto exit;
      }

      bytes_left -= bytes_to_write;

      if (output) {
        if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output))
        {
          unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
          goto exit;
        }
      }

      total_written += bytes_to_write;

    }
  }

  if (file_descriptor->expanded_size != total_written)
  {
    unshield_error("Expanded size expected to be %i, but was %i", 
        file_descriptor->expanded_size, total_written);
    goto exit;
  }

  success = true;
  
exit:
  unshield_reader_destroy(reader);
  FCLOSE(unshield, output);
  FREE(input_buffer);
  FREE(output_buffer);
  return success;
}